

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,string_view begin_varname,string_view end_varname,string_view file_path,
          vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  ulong uVar1;
  AnnotationCollector *pAVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  PrintOptions opts_00;
  PrintOptions opts_01;
  bool bVar5;
  pair<unsigned_long,_unsigned_long> *ppVar6;
  LogMessage *pLVar7;
  allocator<char> local_149;
  string local_148 [32];
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_110;
  LogMessage local_f0;
  Voidify local_da;
  undefined8 local_d9;
  undefined8 local_c9;
  size_t local_c0;
  char *local_b8;
  undefined1 local_b0 [8];
  optional<std::pair<unsigned_long,_unsigned_long>_> end;
  undefined1 local_68 [8];
  optional<std::pair<unsigned_long,_unsigned_long>_> begin;
  undefined5 uStack_46;
  PrintOptions opts;
  vector<int,_std::allocator<int>_> *path_local;
  Printer *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  string_view end_varname_local;
  string_view begin_varname_local;
  
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    PrintOptions::PrintOptions
              ((PrintOptions *)
               &begin.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                field_0x17);
    unique0x100002c2 = CONCAT53(uStack_46,CONCAT12(1,stack0xffffffffffffffb7));
    opts_01.use_annotation_frames =
         (bool)opts.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_;
    opts_01.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         stack0xffffffffffffffb7;
    opts_01.checks_are_debug_only = true;
    opts_01.use_substitution_map = (bool)(char)uStack_46;
    opts_01.use_curly_brace_substitutions = (bool)(char)((uint5)uStack_46 >> 8);
    opts_01.allow_digit_substitutions = (bool)(char)((uint5)uStack_46 >> 0x10);
    opts_01.strip_spaces_around_vars = (bool)(char)((uint5)uStack_46 >> 0x18);
    opts_01.strip_raw_string_indentation = (bool)(char)((uint5)uStack_46 >> 0x20);
    GetSubstitutionRange
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_68,this,begin_varname,
               opts_01);
    local_d9 = CONCAT53(uStack_46,CONCAT12(1,stack0xffffffffffffffb7));
    opts_00.use_annotation_frames =
         (bool)opts.loc.
               super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
               _M_payload.
               super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_;
    opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         stack0xffffffffffffffb7;
    opts_00.checks_are_debug_only = true;
    opts_00.use_substitution_map = (bool)(char)uStack_46;
    opts_00.use_curly_brace_substitutions = (bool)(char)((uint5)uStack_46 >> 8);
    opts_00.allow_digit_substitutions = (bool)(char)((uint5)uStack_46 >> 0x10);
    opts_00.strip_spaces_around_vars = (bool)(char)((uint5)uStack_46 >> 0x18);
    opts_00.strip_raw_string_indentation = (bool)(char)((uint5)uStack_46 >> 0x20);
    local_c9 = local_d9;
    local_c0 = end_varname._M_len;
    local_b8 = end_varname._M_str;
    GetSubstitutionRange
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_b0,this,end_varname,
               opts_00);
    bVar5 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::has_value
                      ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_68);
    if ((bVar5) &&
       (bVar5 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::has_value
                          ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_b0), bVar5))
    {
      ppVar6 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                         ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_68);
      uVar1 = ppVar6->first;
      ppVar6 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                         ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_b0);
      if (ppVar6->second < uVar1) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                   ,0x189);
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f0);
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar7,(char (*) [37])"annotation has negative length from ");
        local_118 = begin_varname._M_len;
        pcStack_110 = begin_varname._M_str;
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,begin_varname);
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar7,(char (*) [5])0x21377bd);
        local_128 = end_varname._M_len;
        pcStack_120 = end_varname._M_str;
        pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar7,end_varname);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_da,pLVar7);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_f0);
      }
      else {
        pAVar2 = (this->options_).annotation_collector;
        ppVar6 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                           ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_68);
        uVar3 = ppVar6->first;
        ppVar6 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                           ((optional<std::pair<unsigned_long,_unsigned_long>_> *)local_b0);
        uVar4 = ppVar6->second;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_148,&file_path,&local_149);
        (*pAVar2->_vptr_AnnotationCollector[3])
                  (pAVar2,uVar3,uVar4,local_148,path,
                   semantic.
                   super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                  );
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator(&local_149);
      }
    }
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname,
                       absl::string_view file_path,
                       const std::vector<int>& path,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  PrintOptions opts;
  opts.checks_are_debug_only = true;
  auto begin = GetSubstitutionRange(begin_varname, opts);
  auto end = GetSubstitutionRange(end_varname, opts);
  if (!begin.has_value() || !end.has_value()) {
    return;
  }
  if (begin->first > end->second) {
    ABSL_DLOG(FATAL) << "annotation has negative length from " << begin_varname
                     << " to " << end_varname;
    return;
  }
  options_.annotation_collector->AddAnnotation(
      begin->first, end->second, std::string(file_path), path, semantic);
}